

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *orderedPrims)

{
  bool bVar1;
  size_type end_00;
  function<void_(long)> *func;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *pvVar2;
  size_type sVar3;
  reference pvVar4;
  BVHBuildNode *pBVar5;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *in_RDX;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  Point3f PVar8;
  LBVHTreelet *treelet;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *__range1_1;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  atomic<int> orderedPrimsOffset;
  BVHBuildNode *nodes;
  int maxBVHNodes;
  size_t nPrimitives;
  uint32_t mask;
  size_t end;
  size_t start;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  atomic<int> *in_stack_000001b0;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> mortonPrims;
  Allocator in_stack_000001d0;
  BVHPrimitive *prim;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  Bounds3f bounds;
  value_type *in_stack_fffffffffffffd88;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *in_stack_fffffffffffffd90;
  anon_class_56_7_0065a05a *in_stack_fffffffffffffd98;
  function<void_(long)> *in_stack_fffffffffffffda0;
  function<void_(long)> *this_00;
  size_type in_stack_fffffffffffffda8;
  Bounds3<float> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *in_stack_fffffffffffffdc0;
  undefined1 *start_00;
  __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
  local_1f8;
  function<void_(long)> *local_1f0;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> local_1e8;
  function<void_(long)> *local_1d0;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_1c0;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_1b8;
  BVHPrimitive *in_stack_fffffffffffffe50;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffe68;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *local_138;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *local_130;
  function<void_(long)> local_128;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_108;
  undefined8 *local_100;
  undefined1 local_c1;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_c0;
  ulong local_a8;
  float local_a0;
  ulong local_98;
  float local_90;
  ulong local_88;
  float local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  reference local_60;
  BVHPrimitive *local_58;
  __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
  local_50;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_18;
  undefined1 auVar7 [56];
  
  local_18 = in_RDX;
  Bounds3<float>::Bounds3(in_stack_fffffffffffffdb0);
  local_48 = local_18;
  local_50._M_current =
       (BVHPrimitive *)
       std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::begin
                 ((vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                  in_stack_fffffffffffffd88);
  local_58 = (BVHPrimitive *)
             std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::end
                       ((vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                        in_stack_fffffffffffffd88);
  while( true ) {
    auVar7 = in_ZMM0._8_56_;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
                        *)in_stack_fffffffffffffd88);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
               ::operator*(&local_50);
    PVar8 = BVHPrimitive::Centroid(in_stack_fffffffffffffe50);
    local_a0 = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_a8 = vmovlpd_avx(auVar6._0_16_);
    in_ZMM0 = ZEXT864(local_a8);
    local_98 = local_a8;
    local_90 = local_a0;
    local_88 = local_a8;
    local_80 = local_a0;
    Union<float>((Bounds3<float> *)in_stack_fffffffffffffe50,
                 (Point3<float>)in_stack_fffffffffffffe68);
    local_40 = local_78;
    local_38 = local_70;
    local_30 = local_68;
    __gnu_cxx::
    __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
    ::operator++(&local_50);
  }
  end_00 = std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::size(local_18);
  start_00 = &local_c1;
  std::allocator<pbrt::MortonPrimitive>::allocator((allocator<pbrt::MortonPrimitive> *)0x5f219e);
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (allocator_type *)in_stack_fffffffffffffda0);
  std::allocator<pbrt::MortonPrimitive>::~allocator((allocator<pbrt::MortonPrimitive> *)0x5f21c4);
  func = (function<void_(long)> *)
         std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::size(local_18);
  local_128._M_invoker = (_Invoker_type)&local_c0;
  local_108 = local_18;
  local_100 = &local_40;
  std::function<void(long)>::
  function<pbrt::BVHAggregate::buildHLBVH(pstd::pmr::polymorphic_allocator<std::byte>,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,std::atomic<int>*,std::vector<pbrt::Primitive,std::allocator<pbrt::Primitive>>&)::__0,void>
            (in_stack_fffffffffffffda0,(anon_class_24_3_903895b6 *)in_stack_fffffffffffffd98);
  ParallelFor((int64_t)start_00,end_00,func);
  std::function<void_(long)>::~function((function<void_(long)> *)0x5f2242);
  RadixSort((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
            finishedTreelets.
            super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::vector
            ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)0x5f225e);
  local_130 = (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)0x0;
  local_138 = (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)0x1;
  do {
    pvVar2 = (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
             std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::size
                       (&local_c0);
    if (pvVar2 < local_138) {
      this_00 = &local_128;
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::size
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)this_00);
      local_1c0 = local_18;
      local_1b8 = &local_c0;
      local_1d0 = this_00;
      std::function<void(long)>::
      function<pbrt::BVHAggregate::buildHLBVH(pstd::pmr::polymorphic_allocator<std::byte>,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,std::atomic<int>*,std::vector<pbrt::Primitive,std::allocator<pbrt::Primitive>>&)::__1,void>
                (this_00,in_stack_fffffffffffffd98);
      ParallelFor((int64_t)start_00,end_00,func);
      std::function<void_(long)>::~function((function<void_(long)> *)0x5f253c);
      pvVar2 = &local_1e8;
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::vector
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)0x5f254e);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::size
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)&local_128);
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
                (in_stack_fffffffffffffdc0,
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_1f0 = &local_128;
      local_1f8._M_current =
           (LBVHTreelet *)
           std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::begin
                     ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)
                      in_stack_fffffffffffffd88);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::end
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)
                 in_stack_fffffffffffffd88);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
                            *)in_stack_fffffffffffffd90,
                           (__normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
                            *)in_stack_fffffffffffffd88);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
        ::operator*(&local_1f8);
        std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::push_back
                  ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)this_00,
                   (value_type *)pvVar2);
        __gnu_cxx::
        __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
        ::operator++(&local_1f8);
      }
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::size(&local_1e8);
      pBVar5 = buildUpperSAH((BVHAggregate *)
                             mortonPrims.
                             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_000001d0,
                             (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                             mortonPrims.
                             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             mortonPrims.
                             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)mortonPrims.
                                  super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start,in_stack_000001b0);
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::~vector
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)this_00);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::~vector
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)this_00);
      std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~vector
                ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)this_00);
      return pBVar5;
    }
    in_stack_fffffffffffffdc0 = local_138;
    sVar3 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::size
                      (&local_c0);
    if (in_stack_fffffffffffffdc0 ==
        (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)(long)(int)sVar3) {
LAB_005f2327:
      pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::BVHBuildNode>
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd90,
                 (size_t)in_stack_fffffffffffffd88);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::push_back
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_130 = local_138;
    }
    else {
      pvVar4 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::
               operator[](&local_c0,(size_type)local_130);
      in_stack_fffffffffffffdbc = pvVar4->mortonCode & 0x3ffc0000;
      pvVar4 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::
               operator[](&local_c0,(size_type)local_138);
      if (in_stack_fffffffffffffdbc != (pvVar4->mortonCode & 0x3ffc0000)) goto LAB_005f2327;
    }
    local_138 = (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                ((long)&(local_138->
                        super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<Primitive> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &prim : bvhPrimitives)
        bounds = Union(bounds, prim.Centroid());

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].Centroid());
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (size_t start = 0, end = 1; end <= mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            size_t nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}